

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O3

int rnndec_varmatch(rnndeccontext *ctx,rnnvarinfo *vi)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  
  if (vi->dead == 0) {
    iVar2 = vi->varsetsnum;
    iVar4 = 1;
    if (0 < iVar2) {
      lVar5 = 0;
      do {
        iVar1 = ctx->varsnum;
        uVar3 = 0;
        if ((long)iVar1 < 1) {
LAB_0010759c:
          if ((int)uVar3 == iVar1) goto LAB_001075d4;
          if (vi->varsets[lVar5]->variants[ctx->vars[uVar3 & 0xffffffff]->variant] == 0)
          goto LAB_00107535;
        }
        else {
          uVar3 = 0;
          do {
            if (vi->varsets[lVar5]->venum == ctx->vars[uVar3]->en) goto LAB_0010759c;
            uVar3 = uVar3 + 1;
          } while ((long)iVar1 != uVar3);
LAB_001075d4:
          fprintf(_stderr,"I don\'t know which %s variant to use!\n",vi->varsets[lVar5]->venum->name
                 );
          iVar2 = vi->varsetsnum;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar2);
    }
  }
  else {
LAB_00107535:
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int rnndec_varmatch(struct rnndeccontext *ctx, struct rnnvarinfo *vi) {
	if (vi->dead)
		return 0;
	int i;
	for (i = 0; i < vi->varsetsnum; i++) {
		int j;
		for (j = 0; j < ctx->varsnum; j++)
			if (vi->varsets[i]->venum == ctx->vars[j]->en)
				break;
		if (j == ctx->varsnum) {
			fprintf (stderr, "I don't know which %s variant to use!\n", vi->varsets[i]->venum->name);
		} else {
			if (!vi->varsets[i]->variants[ctx->vars[j]->variant])
				return 0;
		}
	}
	return 1;
}